

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode Curl_sasl_decode_digest_http_message(char *chlg,digestdata *digest)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char *first;
  undefined4 extraout_var;
  bool bVar6;
  byte bVar7;
  byte *pbVar8;
  int iVar9;
  char *tok_buf;
  char value [256];
  char content [1024];
  CURLcode local_56c;
  byte *local_558;
  ulong local_550;
  char *local_548;
  char *local_540;
  char local_538 [256];
  char local_438 [1032];
  
  local_548 = digest->nonce;
  local_558 = (byte *)chlg;
  Curl_sasl_digest_cleanup(digest);
  local_550 = 0;
  bVar6 = false;
  do {
    pbVar1 = local_558;
    bVar7 = *local_558;
    if (bVar7 != 0) {
      ppuVar4 = __ctype_b_loc();
      local_558 = pbVar1;
      do {
        if ((*(byte *)((long)*ppuVar4 + (ulong)bVar7 * 2 + 1) & 0x20) == 0) break;
        bVar7 = local_558[1];
        local_558 = local_558 + 1;
      } while (bVar7 != 0);
    }
    iVar3 = Curl_sasl_digest_get_pair((char *)local_558,local_538,local_438,(char **)&local_558);
    iVar9 = 2;
    if (iVar3 == 0) {
      iVar3 = Curl_raw_equal(local_538,"nonce");
      if (iVar3 != 0) {
        pcVar5 = (*Curl_cstrdup)(local_438);
        digest->nonce = pcVar5;
        goto LAB_005860df;
      }
      iVar3 = Curl_raw_equal(local_538,"stale");
      if (iVar3 != 0) {
        iVar3 = Curl_raw_equal(local_438,"true");
        if (iVar3 != 0) {
          digest->stale = true;
          digest->nc = 1;
        }
        goto LAB_0058612e;
      }
      iVar3 = Curl_raw_equal(local_538,"realm");
      if (iVar3 == 0) {
        iVar3 = Curl_raw_equal(local_538,"opaque");
        if (iVar3 != 0) {
          pcVar5 = (*Curl_cstrdup)(local_438);
          digest->opaque = pcVar5;
          goto LAB_005860df;
        }
        iVar3 = Curl_raw_equal(local_538,"qop");
        if (iVar3 != 0) {
          pcVar5 = (*Curl_cstrdup)(local_438);
          if (pcVar5 == (char *)0x0) {
LAB_0058633a:
            bVar2 = false;
            local_56c = CURLE_OUT_OF_MEMORY;
          }
          else {
            first = strtok_r(pcVar5,",",&local_540);
            while (first != (char *)0x0) {
              iVar3 = Curl_raw_equal(first,"auth");
              if (iVar3 == 0) {
                iVar3 = Curl_raw_equal(first,"auth-int");
                if (iVar3 != 0) {
                  bVar6 = true;
                }
              }
              else {
                local_550 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
              }
              first = strtok_r((char *)0x0,",",&local_540);
            }
            (*Curl_cfree)(pcVar5);
            if ((local_550 & 1) == 0) {
              if (bVar6) {
                pcVar5 = "auth-int";
                goto LAB_0058631f;
              }
            }
            else {
              pcVar5 = "auth";
LAB_0058631f:
              pcVar5 = (*Curl_cstrdup)(pcVar5);
              digest->qop = pcVar5;
              if (pcVar5 == (char *)0x0) goto LAB_0058633a;
            }
            bVar2 = true;
          }
          iVar9 = 1;
          if (!bVar2) goto LAB_0058616f;
          goto LAB_0058612e;
        }
        iVar3 = Curl_raw_equal(local_538,"algorithm");
        if (iVar3 == 0) goto LAB_0058612e;
        pcVar5 = (*Curl_cstrdup)(local_438);
        digest->algorithm = pcVar5;
        iVar9 = 1;
        if (pcVar5 != (char *)0x0) {
          iVar3 = Curl_raw_equal(local_438,"MD5-sess");
          if (iVar3 == 0) {
            iVar3 = Curl_raw_equal(local_438,"MD5");
            if (iVar3 == 0) {
              local_56c = CURLE_BAD_CONTENT_ENCODING;
              goto LAB_0058616f;
            }
            digest->algo = 0;
          }
          else {
            digest->algo = 1;
          }
          goto LAB_0058612e;
        }
      }
      else {
        pcVar5 = (*Curl_cstrdup)(local_438);
        digest->realm = pcVar5;
LAB_005860df:
        if (pcVar5 != (char *)0x0) {
LAB_0058612e:
          pbVar1 = local_558;
          bVar7 = *local_558;
          if (bVar7 != 0) {
            ppuVar4 = __ctype_b_loc();
            do {
              pbVar8 = pbVar1 + 1;
              if ((*(byte *)((long)*ppuVar4 + (ulong)bVar7 * 2 + 1) & 0x20) == 0) {
                local_558 = pbVar1;
                if (bVar7 == 0x2c) {
                  local_558 = pbVar8;
                }
                break;
              }
              bVar7 = *pbVar8;
              pbVar1 = pbVar8;
              local_558 = pbVar8;
            } while (bVar7 != 0);
          }
          iVar9 = 0;
          goto LAB_0058616f;
        }
      }
      iVar9 = 1;
      local_56c = CURLE_OUT_OF_MEMORY;
    }
LAB_0058616f:
    if (iVar9 != 0) {
      if ((iVar9 == 2) &&
         (((local_548 == (char *)0x0 ||
           (local_56c = CURLE_BAD_CONTENT_ENCODING, digest->stale == true)) &&
          (local_56c = CURLE_BAD_CONTENT_ENCODING, digest->nonce != (char *)0x0)))) {
        local_56c = CURLE_OK;
      }
      return local_56c;
    }
  } while( true );
}

Assistant:

CURLcode Curl_sasl_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_sasl_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(!Curl_sasl_digest_get_pair(chlg, value, content, &chlg)) {
      if(Curl_raw_equal(value, "nonce")) {
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "stale")) {
        if(Curl_raw_equal(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(Curl_raw_equal(value, "realm")) {
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "opaque")) {
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(Curl_raw_equal(value, "qop")) {
        char *tok_buf;
        /* Tokenize the list and choose auth if possible, use a temporary
            clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token != NULL) {
          if(Curl_raw_equal(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(Curl_raw_equal(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(Curl_raw_equal(value, "algorithm")) {
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(Curl_raw_equal(content, "MD5-sess"))
          digest->algo = CURLDIGESTALGO_MD5SESS;
        else if(Curl_raw_equal(content, "MD5"))
          digest->algo = CURLDIGESTALGO_MD5;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else {
        /* unknown specifier, ignore it! */
      }
    }
    else
      break; /* we're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}